

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O3

void crnlib::LzmaEncProps_Normalize(CLzmaEncProps *p)

{
  int iVar1;
  uint uVar2;
  UInt32 UVar3;
  uint uVar4;
  uint uVar5;
  
  iVar1 = 5;
  if (-1 < p->level) {
    iVar1 = p->level;
  }
  p->level = iVar1;
  if (p->dictSize == 0) {
    if (iVar1 < 6) {
      UVar3 = 1 << ((char)iVar1 * '\x02' + 0xeU & 0x1f);
    }
    else {
      UVar3 = (uint)(iVar1 != 6) * 0x2000000 + 0x2000000;
    }
    p->dictSize = UVar3;
  }
  if (p->lc < 0) {
    p->lc = 3;
  }
  if (p->lp < 0) {
    p->lp = 0;
  }
  if (p->pb < 0) {
    p->pb = 2;
  }
  uVar4 = p->algo;
  if ((int)uVar4 < 0) {
    uVar4 = (uint)(4 < iVar1);
    p->algo = uVar4;
  }
  uVar5 = p->fb;
  if ((int)uVar5 < 0) {
    uVar5 = (uint)(6 < iVar1) * 0x20 + 0x20;
    p->fb = uVar5;
  }
  uVar2 = p->btMode;
  if ((int)uVar2 < 0) {
    uVar2 = (uint)(uVar4 != 0);
    p->btMode = uVar2;
  }
  if (p->numHashBytes < 0) {
    p->numHashBytes = 4;
  }
  if (p->mc == 0) {
    p->mc = (uVar5 >> 1) + 0x10 >> (uVar2 == 0);
  }
  if (-1 < p->numThreads) {
    return;
  }
  p->numThreads = 2 - (uint)(uVar4 == 0 || uVar2 == 0);
  return;
}

Assistant:

void LzmaEncProps_Normalize(CLzmaEncProps* p) {
  int level = p->level;
  if (level < 0)
    level = 5;
  p->level = level;
  if (p->dictSize == 0)
    p->dictSize = (level <= 5 ? (1 << (level * 2 + 14)) : (level == 6 ? (1 << 25) : (1 << 26)));
  if (p->lc < 0)
    p->lc = 3;
  if (p->lp < 0)
    p->lp = 0;
  if (p->pb < 0)
    p->pb = 2;
  if (p->algo < 0)
    p->algo = (level < 5 ? 0 : 1);
  if (p->fb < 0)
    p->fb = (level < 7 ? 32 : 64);
  if (p->btMode < 0)
    p->btMode = (p->algo == 0 ? 0 : 1);
  if (p->numHashBytes < 0)
    p->numHashBytes = 4;
  if (p->mc == 0)
    p->mc = (16 + (p->fb >> 1)) >> (p->btMode ? 0 : 1);
  if (p->numThreads < 0)
    p->numThreads = ((p->btMode && p->algo) ? 2 : 1);
}